

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter_tree.cc
# Opt level: O3

string * __thiscall
re2::PrefilterTree::DebugNodeString_abi_cxx11_
          (string *__return_storage_ptr__,PrefilterTree *this,Prefilter *node)

{
  Op OVar1;
  ulong uVar2;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  if (node->op_ == ATOM) {
    if ((node->atom_)._M_string_length != 0) {
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)(node->atom_)._M_dataplus._M_p);
      return __return_storage_ptr__;
    }
    __assert_fail("!node->atom().empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/extern/re2/re2/prefilter_tree.cc"
                  ,0x176,"std::string re2::PrefilterTree::DebugNodeString(Prefilter *) const");
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  OVar1 = node->op_;
  if (OVar1 - AND < 2) {
    uVar2 = 0;
    do {
      if ((ulong)((long)(node->subs_->
                        super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(node->subs_->
                        super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>).
                        _M_impl.super__Vector_impl_data._M_start >> 3) <= uVar2) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      if (uVar2 != 0) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        OVar1 = node->op_;
      }
      if (1 < OVar1 - AND) break;
      StringPrintf_abi_cxx11_
                (&local_50,"%d",
                 (ulong)(uint)(node->subs_->
                              super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar2]->unique_id_);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (1 < node->op_ - AND) break;
      DebugNodeString_abi_cxx11_
                (&local_50,this,
                 (node->subs_->
                 super__Vector_base<re2::Prefilter_*,_std::allocator<re2::Prefilter_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar2]);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      uVar2 = uVar2 + 1;
      OVar1 = node->op_;
    } while (OVar1 - AND < 2);
  }
  __assert_fail("op_ == AND || op_ == OR",
                "/workspace/llm4binary/github/license_c_cmakelists/zeux[P]qgrep/extern/re2/re2/prefilter.h"
                ,0x2e,"std::vector<Prefilter *> *re2::Prefilter::subs()");
}

Assistant:

std::string PrefilterTree::DebugNodeString(Prefilter* node) const {
  std::string node_string = "";
  if (node->op() == Prefilter::ATOM) {
    DCHECK(!node->atom().empty());
    node_string += node->atom();
  } else {
    // Adding the operation disambiguates AND and OR nodes.
    node_string +=  node->op() == Prefilter::AND ? "AND" : "OR";
    node_string += "(";
    for (size_t i = 0; i < node->subs()->size(); i++) {
      if (i > 0)
        node_string += ',';
      node_string += StringPrintf("%d", (*node->subs())[i]->unique_id());
      node_string += ":";
      node_string += DebugNodeString((*node->subs())[i]);
    }
    node_string += ")";
  }
  return node_string;
}